

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

Ptr priExpress(TokenReader *tokens)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  SimpleASTNode *pSVar3;
  invalid_argument *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  Ptr PVar5;
  uint local_88;
  Token token;
  SimpleASTNode *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined1 local_29;
  
  *(undefined8 *)tokens = 0;
  *(undefined8 *)(tokens + 8) = 0;
  TokenReader::peek();
  if (local_88 == 0x10) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this,"Invalid arguments, valid variable or literal is required!");
  }
  else {
    if (local_88 < 2) {
      TokenReader::read();
      std::__cxx11::string::operator=((string *)&token,(string *)a_Stack_50);
      if (a_Stack_50[0]._M_pi != &local_40) {
        operator_delete(a_Stack_50[0]._M_pi);
      }
      token.val.field_2._12_4_ = ((int)local_58 == 0) + 1;
      local_58 = (SimpleASTNode *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<SimpleASTNode,std::allocator<SimpleASTNode>,ASTNodeType_const&,std::__cxx11::string_const&>
                (a_Stack_50,&local_58,(allocator<SimpleASTNode> *)&local_29,
                 (ASTNodeType *)(token.val.field_2._M_local_buf + 0xc),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token);
      _Var4._M_pi = a_Stack_50[0]._M_pi;
      pSVar3 = local_58;
      local_58 = (SimpleASTNode *)0x0;
      a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(tokens + 8);
      *(SimpleASTNode **)tokens = pSVar3;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(tokens + 8) = _Var4._M_pi;
      _Var4._M_pi = extraout_RDX;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        _Var4._M_pi = extraout_RDX_00;
      }
      if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
        _Var4._M_pi = extraout_RDX_01;
      }
LAB_00109afe:
      if ((size_type *)token._0_8_ != &token.val._M_string_length) {
        operator_delete((void *)token._0_8_);
        _Var4._M_pi = extraout_RDX_04;
      }
      PVar5.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var4._M_pi;
      PVar5.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)tokens;
      return (Ptr)PVar5.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (local_88 == 0xe) {
      TokenReader::read();
      std::__cxx11::string::operator=((string *)&token,(string *)a_Stack_50);
      if (a_Stack_50[0]._M_pi != &local_40) {
        operator_delete(a_Stack_50[0]._M_pi);
      }
      express((TokenReader *)&local_58);
      _Var4._M_pi = a_Stack_50[0]._M_pi;
      pSVar3 = local_58;
      local_58 = (SimpleASTNode *)0x0;
      a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(tokens + 8);
      *(SimpleASTNode **)tokens = pSVar3;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(tokens + 8) = _Var4._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
      }
      TokenReader::read();
      iVar2 = (int)local_58;
      std::__cxx11::string::operator=((string *)&token,(string *)a_Stack_50);
      _Var4._M_pi = extraout_RDX_02;
      if (a_Stack_50[0]._M_pi != &local_40) {
        operator_delete(a_Stack_50[0]._M_pi);
        _Var4._M_pi = extraout_RDX_03;
      }
      if (iVar2 == 0xf) goto LAB_00109afe;
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Lack of right bracket \")\"");
    }
    else {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this,"Invalid arguments, valid variable or literal is required!");
    }
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static SimpleASTNode::Ptr priExpress(TokenReader& tokens)
{
    //std::cout << "in pri express" << std::endl;
    SimpleASTNode::Ptr node = nullptr;
    Token token = tokens.peek();
    //std::cout << "token type " << token.type << std::endl;
    if (!token.isEmpty()) {
        if (token.type == TokenType::ID_TYPE || token.type == TokenType::INT_LITERAL_TYPE) {
            token = tokens.read();
            node = SimpleASTNode::create((token.type == TokenType::ID_TYPE) ? ASTNodeType::ID :
                   ASTNodeType::INT_LITERAL,  token.val);
        } else if (token.type == TokenType::LBRACKET_TYPE) {
            token = tokens.read();
            node = express(tokens);
            token = tokens.read(); // consume the ")"
            if (token.isEmpty() || token.type != TokenType::RBRACKET_TYPE)
                throw std::invalid_argument("Lack of right bracket \")\"");
        } else {
            throw std::invalid_argument("Invalid arguments, valid variable or literal is required!");
        }
    } else {
        throw std::invalid_argument("Invalid arguments, valid variable or literal is required!");
    }
    return node;
}